

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

bool CLI::detail::valid_later_char<char>(char c)

{
  bool bVar1;
  
  bVar1 = valid_first_char<char>(c);
  return bVar1 || (byte)(c - 0x2dU) < 2;
}

Assistant:

inline bool valid_name_string(const std::string &str) {
    if(str.empty() || !valid_first_char(str[0]))
        return false;
    for(auto c : str.substr(1))
        if(!valid_later_char(c))
            return false;
    return true;
}